

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_WriteProperties(CLzmaEncHandle pp,Byte *props,SizeT *size)

{
  byte bVar1;
  uint local_38;
  int local_34;
  UInt32 dictSize;
  int i;
  CLzmaEnc *p;
  SizeT *size_local;
  Byte *props_local;
  CLzmaEncHandle pp_local;
  
  local_38 = *(uint *)((long)pp + 0x3d350);
  if (*size < 5) {
    pp_local._4_4_ = 5;
  }
  else {
    *size = 5;
    *props = ((char)*(undefined4 *)((long)pp + 0x33bd4) * '\x05' +
             (char)*(undefined4 *)((long)pp + 0x33bd0)) * '\t' +
             (char)*(undefined4 *)((long)pp + 0x33bcc);
    for (local_34 = 0xb; local_34 < 0x1f; local_34 = local_34 + 1) {
      bVar1 = (byte)local_34;
      if (local_38 <= (uint)(2 << (bVar1 & 0x1f))) {
        local_38 = 2 << (bVar1 & 0x1f);
        break;
      }
      if (local_38 <= (uint)(3 << (bVar1 & 0x1f))) {
        local_38 = 3 << (bVar1 & 0x1f);
        break;
      }
    }
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      props[local_34 + 1] = (Byte)(local_38 >> ((byte)(local_34 << 3) & 0x1f));
    }
    pp_local._4_4_ = 0;
  }
  return pp_local._4_4_;
}

Assistant:

SRes LzmaEnc_WriteProperties(CLzmaEncHandle pp, Byte* props, SizeT* size) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  int i;
  UInt32 dictSize = p->dictSize;
  if (*size < LZMA_PROPS_SIZE)
    return SZ_ERROR_PARAM;
  *size = LZMA_PROPS_SIZE;
  props[0] = (Byte)((p->pb * 5 + p->lp) * 9 + p->lc);

  for (i = 11; i <= 30; i++) {
    if (dictSize <= ((UInt32)2 << i)) {
      dictSize = (2 << i);
      break;
    }
    if (dictSize <= ((UInt32)3 << i)) {
      dictSize = (3 << i);
      break;
    }
  }

  for (i = 0; i < 4; i++)
    props[1 + i] = (Byte)(dictSize >> (8 * i));
  return SZ_OK;
}